

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int notRecursiveHugeTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr ctxt_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  bool bVar8;
  unsigned_long total_size;
  unsigned_long d_size;
  unsigned_long e_size;
  unsigned_long f_size;
  unsigned_long allowed_expansion;
  unsigned_long fixed_cost;
  xmlEntityPtr ent;
  int parserOptions;
  int res;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  ent._0_4_ = 0x10;
  nb_tests = nb_tests + 1;
  ctxt_00 = (xmlParserCtxtPtr)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    initSAX(ctxt_00);
  }
  if ((options & 2U) == 0) {
    ent._0_4_ = 0x12;
  }
  lVar3 = xmlCtxtReadFile(ctxt_00,"test/recurse/huge.xml",0,ent._0_4_);
  if (lVar3 == 0) {
    fprintf(_stderr,"Failed to parse huge.xml\n");
    ent._4_4_ = 1;
  }
  else {
    iVar1 = xmlStrlen("some internal data");
    lVar4 = xmlGetDocEntity(lVar3,"e");
    iVar2 = xmlStrlen("&f;");
    lVar5 = (long)iVar1 * 2 + (long)(iVar2 << 1) + 0x28;
    bVar8 = *(long *)(lVar4 + 0x88) != lVar5;
    if (bVar8) {
      fprintf(_stderr,"Wrong size for entity e: %lu (expected %lu)\n",*(undefined8 *)(lVar4 + 0x88),
              lVar5);
    }
    ent._4_4_ = (uint)bVar8;
    lVar4 = xmlGetDocEntity(lVar3,"b");
    if (*(long *)(lVar4 + 0x88) != lVar5) {
      fprintf(_stderr,"Wrong size for entity b: %lu (expected %lu)\n",*(undefined8 *)(lVar4 + 0x88),
              lVar5);
      ent._4_4_ = 1;
    }
    lVar4 = xmlGetDocEntity(lVar3,"d");
    iVar2 = xmlStrlen("&e;");
    lVar6 = lVar5 * 2 + (long)(iVar2 << 1) + 0x28;
    if (*(long *)(lVar4 + 0x88) != lVar6) {
      fprintf(_stderr,"Wrong size for entity d: %lu (expected %lu)\n",*(undefined8 *)(lVar4 + 0x88),
              lVar6);
      ent._4_4_ = 1;
    }
    lVar4 = xmlGetDocEntity(lVar3,"c");
    if (*(long *)(lVar4 + 0x88) != lVar6) {
      fprintf(_stderr,"Wrong size for entity c: %lu (expected %lu)\n",*(undefined8 *)(lVar4 + 0x88),
              lVar6);
      ent._4_4_ = 1;
    }
    if (ctxt_00->sizeentcopy < 1000000) {
      fprintf(_stderr,"Total entity size too small: %lu\n",ctxt_00->sizeentcopy);
      ent._4_4_ = 1;
    }
    uVar7 = (iVar1 + lVar5 + lVar6 + 0x3c) * 0xbb5;
    if (ctxt_00->sizeentcopy != uVar7) {
      fprintf(_stderr,"Wrong total entity size: %lu (expected %lu)\n",ctxt_00->sizeentcopy,uVar7);
      ent._4_4_ = 1;
    }
    if (ctxt_00->sizeentities != 0x1e) {
      fprintf(_stderr,"Wrong parsed entity size: %lu (expected %lu)\n",ctxt_00->sizeentities,0x1e);
      ent._4_4_ = 1;
    }
  }
  xmlFreeDoc(lVar3);
  xmlFreeParserCtxt(ctxt_00);
  return ent._4_4_;
}

Assistant:

static int
notRecursiveHugeTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int res = 0;
    int parserOptions = XML_PARSE_DTDVALID;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    doc = xmlCtxtReadFile(ctxt, "test/recurse/huge.xml", NULL, parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse huge.xml\n");
	res = 1;
    } else {
        xmlEntityPtr ent;
        unsigned long fixed_cost = 20;
        unsigned long allowed_expansion = 1000000;
        unsigned long f_size = xmlStrlen(BAD_CAST "some internal data");
        unsigned long e_size;
        unsigned long d_size;
        unsigned long total_size;

        ent = xmlGetDocEntity(doc, BAD_CAST "e");
        e_size = f_size * 2 +
                 xmlStrlen(BAD_CAST "&f;") * 2 +
                 fixed_cost * 2;
        if (ent->expandedSize != e_size) {
            fprintf(stderr, "Wrong size for entity e: %lu (expected %lu)\n",
                    ent->expandedSize, e_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "b");
        if (ent->expandedSize != e_size) {
            fprintf(stderr, "Wrong size for entity b: %lu (expected %lu)\n",
                    ent->expandedSize, e_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "d");
        d_size = e_size * 2 +
                 xmlStrlen(BAD_CAST "&e;") * 2 +
                 fixed_cost * 2;
        if (ent->expandedSize != d_size) {
            fprintf(stderr, "Wrong size for entity d: %lu (expected %lu)\n",
                    ent->expandedSize, d_size);
            res = 1;
        }

        ent = xmlGetDocEntity(doc, BAD_CAST "c");
        if (ent->expandedSize != d_size) {
            fprintf(stderr, "Wrong size for entity c: %lu (expected %lu)\n",
                    ent->expandedSize, d_size);
            res = 1;
        }

        if (ctxt->sizeentcopy < allowed_expansion) {
            fprintf(stderr, "Total entity size too small: %lu\n",
                    ctxt->sizeentcopy);
            res = 1;
        }

        total_size = (f_size + e_size + d_size + 3 * fixed_cost) *
                     (MAX_NODES - 1) * 3;
        if (ctxt->sizeentcopy != total_size) {
            fprintf(stderr, "Wrong total entity size: %lu (expected %lu)\n",
                    ctxt->sizeentcopy, total_size);
            res = 1;
        }

        if (ctxt->sizeentities != 30) {
            fprintf(stderr, "Wrong parsed entity size: %lu (expected %lu)\n",
                    ctxt->sizeentities, 30lu);
            res = 1;
        }
    }

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}